

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O0

void __thiscall kj::ArrayBuilder<unsigned_int>::resize(ArrayBuilder<unsigned_int> *this,size_t size)

{
  size_t sVar1;
  uint *puVar2;
  uint *target;
  size_t size_local;
  ArrayBuilder<unsigned_int> *this_local;
  
  sVar1 = capacity(this);
  if (size <= sVar1) {
    puVar2 = this->ptr + size;
    if (this->pos < puVar2) {
      this->pos = puVar2;
    }
    else {
      this->pos = puVar2;
    }
    return;
  }
  kj::_::inlineRequireFailure
            ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/array.h"
             ,0x1d3,"size <= capacity()","\"can\'t resize past capacity\"",
             "can\'t resize past capacity");
}

Assistant:

void resize(size_t size) {
    KJ_IREQUIRE(size <= capacity(), "can't resize past capacity");

    T* target = ptr + size;
    if (target > pos) {
      // expand
      if (KJ_HAS_TRIVIAL_CONSTRUCTOR(T)) {
        // const_cast is safe here because the member won't ever be dereferenced because it
        // points to the end of the segment.
        pos = const_cast<RemoveConst<T>*>(target);
      } else {
        while (pos < target) {
          kj::ctor(*pos++);
        }
      }
    } else {
      // truncate
      if (KJ_HAS_TRIVIAL_DESTRUCTOR(T)) {
        // const_cast is safe here because the member won't ever be dereferenced because it
        // points to the end of the segment.
        pos = const_cast<RemoveConst<T>*>(target);
      } else {
        while (pos > target) {
          kj::dtor(*--pos);
        }
      }
    }
  }